

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lin_alg.c
# Opt level: O0

void mat_vec(csc *A,c_float *x,c_float *y,c_int plus_eq)

{
  c_int j;
  c_int i;
  c_int plus_eq_local;
  c_float *y_local;
  c_float *x_local;
  csc *A_local;
  
  if (plus_eq == 0) {
    for (i = 0; i < A->m; i = i + 1) {
      y[i] = 0.0;
    }
  }
  if (A->p[A->n] != 0) {
    if (plus_eq == -1) {
      for (j = 0; j < A->n; j = j + 1) {
        for (i = A->p[j]; i < A->p[j + 1]; i = i + 1) {
          y[A->i[i]] = -A->x[i] * x[j] + y[A->i[i]];
        }
      }
    }
    else {
      for (j = 0; j < A->n; j = j + 1) {
        for (i = A->p[j]; i < A->p[j + 1]; i = i + 1) {
          y[A->i[i]] = A->x[i] * x[j] + y[A->i[i]];
        }
      }
    }
  }
  return;
}

Assistant:

void mat_vec(const csc *A, const c_float *x, c_float *y, c_int plus_eq) {
  c_int i, j;

  if (!plus_eq) {
    // y = 0
    for (i = 0; i < A->m; i++) {
      y[i] = 0;
    }
  }

  // if A is empty
  if (A->p[A->n] == 0) {
    return;
  }

  if (plus_eq == -1) {
    // y -=  A*x
    for (j = 0; j < A->n; j++) {
      for (i = A->p[j]; i < A->p[j + 1]; i++) {
        y[A->i[i]] -= A->x[i] * x[j];
      }
    }
  } else {
    // y +=  A*x
    for (j = 0; j < A->n; j++) {
      for (i = A->p[j]; i < A->p[j + 1]; i++) {
        y[A->i[i]] += A->x[i] * x[j];
      }
    }
  }
}